

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRHS.cpp
# Opt level: O2

void __thiscall HDualRHS::create_infeasList(HDualRHS *this,double columnDensity)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  double *__first;
  pointer pcVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  int iRow_1;
  ulong uVar8;
  int iPut;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int i;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar1 = this->workModel->numRow;
  __first = (this->workEdWtFull).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::__fill_n_a<char*,int,int>
            ((this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,uVar1);
  this->workCount = 0;
  this->workCutoff = 0.0;
  uVar8 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    dVar13 = (this->workArray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8];
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = '\x01';
      iVar2 = this->workCount;
      this->workCount = iVar2 + 1;
      (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = (int)uVar8;
    }
  }
  iVar2 = this->workCount;
  dVar13 = (double)iVar2;
  if (columnDensity < 0.05) {
    dVar14 = (double)(int)uVar1 * 0.01;
    dVar12 = 500.0;
    if (500.0 <= dVar14) {
      dVar12 = dVar14;
    }
    if (dVar12 < dVar13) {
      dVar12 = 500.0;
      if (500.0 <= dVar13 * 0.001) {
        dVar12 = dVar13 * 0.001;
      }
      pcVar4 = (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->workArray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->workEdWt).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = 0;
      dVar13 = 0.0;
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        dVar14 = dVar13;
        if (pcVar4[uVar8] != '\0') {
          dVar15 = pdVar5[uVar8] / pdVar6[uVar8];
          dVar14 = dVar15;
          if (dVar15 <= dVar13) {
            dVar14 = dVar13;
          }
          lVar10 = (long)iVar9;
          iVar9 = iVar9 + 1;
          __first[lVar10] = -dVar15;
        }
        dVar13 = dVar14;
      }
      iVar9 = (int)dVar12;
      lVar10 = (long)iVar9;
      std::nth_element<double*>(__first,__first + lVar10,__first + iVar2);
      dVar12 = __first[lVar10];
      dVar14 = dVar12 * -1.00001;
      if (dVar13 * 0.99999 <= dVar14) {
        dVar14 = dVar13 * 0.99999;
      }
      this->workCutoff = dVar14;
      std::__fill_n_a<char*,int,int>
                ((this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,uVar1);
      this->workCount = 0;
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        if ((this->workEdWt).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] * this->workCutoff <=
            (this->workArray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8]) {
          iVar2 = this->workCount;
          this->workCount = iVar2 + 1;
          (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] = (int)uVar8;
          (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = '\x01';
        }
      }
      iVar2 = this->workCount;
      dVar13 = (double)iVar2;
      if ((double)iVar9 * 1.5 < dVar13) {
        this->workCount = iVar9;
        for (; lVar10 < iVar2; lVar10 = lVar10 + 1) {
          piVar7 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar9 = piVar7[lVar10];
          if ((this->workArray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar9] <=
              (this->workEdWt).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar9] * -dVar12) {
            (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9] = '\0';
          }
          else {
            iVar3 = this->workCount;
            this->workCount = iVar3 + 1;
            piVar7[iVar3] = iVar9;
          }
        }
        dVar13 = (double)this->workCount;
      }
    }
  }
  if ((double)(int)uVar1 * 0.2 < dVar13) {
    this->workCount = -uVar1;
    this->workCutoff = 0.0;
  }
  return;
}

Assistant:

void HDualRHS::create_infeasList(double columnDensity) {
    int numRow = workModel->getNumRow();
    double *dwork = &workEdWtFull[0];

// 1. Build the full list
    fill_n(&workMark[0], numRow, 0);
    workCount = 0;
    workCutoff = 0;
    for (int iRow = 0; iRow < numRow; iRow++) {
        if (workArray[iRow]) {
            workMark[iRow] = 1;
            workIndex[workCount++] = iRow;
        }
    }

// 2. See if it worth to try to go sparse
//    (Many candidates, really sparse RHS)
    if (workCount > max(numRow * 0.01, 500.0) && columnDensity < 0.05) {
        int icutoff = max(workCount * 0.001, 500.0);
        double maxMerit = 0;
        for (int iRow = 0, iPut = 0; iRow < numRow; iRow++)
            if (workMark[iRow]) {
                double myMerit = workArray[iRow] / workEdWt[iRow];
                if (maxMerit < myMerit)
                    maxMerit = myMerit;
                dwork[iPut++] = -myMerit;
            }
        nth_element(dwork, dwork + icutoff, dwork + workCount);
        double cutMerit = -dwork[icutoff];
        workCutoff = min(maxMerit * 0.99999, cutMerit * 1.00001);

        // Create again
        fill_n(&workMark[0], numRow, 0);
        workCount = 0;
        for (int iRow = 0; iRow < numRow; iRow++) {
            if (workArray[iRow] >= workEdWt[iRow] * workCutoff) {
                workIndex[workCount++] = iRow;
                workMark[iRow] = 1;
            }
        }

        // Reduce by drop smaller
        if (workCount > icutoff * 1.5) {
            // Firstly take up "icutoff" number of elements
            int fullCount = workCount;
            workCount = icutoff;
            for (int i = icutoff; i < fullCount; i++) {
                int iRow = workIndex[i];
                if (workArray[iRow] > workEdWt[iRow] * cutMerit) {
                    workIndex[workCount++] = iRow;
                } else {
                    workMark[iRow] = 0;
                }
            }
        }

//        cout
//                << "======================================================> WORK COUNT = "
//                << workCount << "\t icutoff = " << icutoff << "\t maxMerit = "
//                << maxMerit << "\t cutMerit = " << cutMerit << endl;
    }

// 3. If there is still too much candidates: disable them
    if (workCount > 0.2 * numRow) {
        workCount = -numRow;
        workCutoff = 0;
    }
}